

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

void __thiscall tonk::RefCounter::StartShutdown(RefCounter *this,uint reason,Result *result)

{
  bool bVar1;
  int in_ESI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> locker;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  atomic<bool> *in_stack_ffffffffffffffa8;
  string local_50 [24];
  Result *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_RDI);
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffa8);
  if (!bVar1) {
    (in_RDI->super___mutex_base)._M_mutex.__data.__lock = in_ESI;
    Result::ToJson_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::__cxx11::string::operator=
              ((string *)((in_RDI->super___mutex_base)._M_mutex.__size + 8),local_50);
    std::__cxx11::string::~string(local_50);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffffa0,SUB81((ulong)in_RDI >> 0x38,0));
    std::__atomic_base<int>::operator--((__atomic_base<int> *)(in_RDI + 1));
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f7248);
  return;
}

Assistant:

void RefCounter::StartShutdown(unsigned reason, const Result& result)
{
    std::lock_guard<std::mutex> locker(ShutdownLock);

    if (Shutdown) {
        return;
    }

    ShutdownReason = reason;
    ShutdownJson = result.ToJson();

    Shutdown = true;

    // Remove self reference
    DecrementReferences();
}